

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCheck.c
# Opt level: O0

void Inter_CheckAddEqual(Inter_Check_t *p,int iVarA,int iVarB)

{
  lit local_28;
  lit local_24;
  int pLits [3];
  int RetValue;
  int iVarB_local;
  int iVarA_local;
  Inter_Check_t *p_local;
  
  pLits[2] = iVarB;
  local_28 = toLitCond(iVarA,1);
  local_24 = toLitCond(pLits[2],0);
  pLits[1] = sat_solver_addclause(p->pSat,&local_28,pLits);
  if (pLits[1] == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intCheck.c"
                  ,0xc9,"void Inter_CheckAddEqual(Inter_Check_t *, int, int)");
  }
  local_28 = toLitCond(pLits[2],1);
  local_24 = toLitCond(iVarA,0);
  pLits[1] = sat_solver_addclause(p->pSat,&local_28,pLits);
  if (pLits[1] != 0) {
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intCheck.c"
                ,0xce,"void Inter_CheckAddEqual(Inter_Check_t *, int, int)");
}

Assistant:

void Inter_CheckAddEqual( Inter_Check_t * p, int iVarA, int iVarB )
{
    int RetValue, pLits[3];
    // add A => B   or   !A + B
    pLits[0] = toLitCond(iVarA, 1);
    pLits[1] = toLitCond(iVarB, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
    assert( RetValue );
    // add B => A   or   !B + A
    pLits[0] = toLitCond(iVarB, 1);
    pLits[1] = toLitCond(iVarA, 0);
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
    assert( RetValue );
}